

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall
QApplicationPrivate::QApplicationPrivate(QApplicationPrivate *this,int *argc,char **argv)

{
  QGuiApplicationPrivate::QGuiApplicationPrivate(&this->super_QGuiApplicationPrivate,argc,argv);
  *(undefined ***)this = &PTR__QApplicationPrivate_007bf460;
  (this->scene_list).d.d = (Data *)0x0;
  (this->scene_list).d.ptr = (QGraphicsScene **)0x0;
  (this->scene_list).d.size = 0;
  this->toolTipWakeUp = Invalid;
  this->toolTipFallAsleep = Invalid;
  (this->toolTipPos).xp = 0;
  (this->toolTipPos).yp = 0;
  (this->toolTipGlobalPos).xp = 0;
  (this->toolTipGlobalPos).yp = 0;
  (this->hoverGlobalPos).xp = 0;
  (this->hoverGlobalPos).yp = 0;
  (this->toolTipWidget).wp.d = (Data *)0x0;
  (this->toolTipWidget).wp.value = (QObject *)0x0;
  this->field_0x90 = 1;
  this->gestureManager = (QGestureManager *)0x0;
  this->gestureWidget = (QWidget *)0x0;
  if (self == (QApplicationPrivate *)0x0) {
    self = this;
  }
  return;
}

Assistant:

QApplicationPrivate::QApplicationPrivate(int &argc, char **argv)
    : QGuiApplicationPrivate(argc, argv)
{
    application_type = QApplicationPrivate::Gui;

#ifndef QT_NO_GESTURES
    gestureManager = nullptr;
    gestureWidget = nullptr;
#endif // QT_NO_GESTURES

    if (!self)
        self = this;
}